

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_header_table.cpp
# Opt level: O0

bool __thiscall BmsHeaderTable::Query(BmsHeaderTable *this,string *key,int *v)

{
  bool bVar1;
  int iVar2;
  BmsHeader *this_00;
  int *v_local;
  string *key_local;
  BmsHeaderTable *this_local;
  
  bVar1 = IsExists(this,key);
  if (bVar1) {
    this_00 = operator[](this,key);
    iVar2 = BmsHeader::ToInteger(this_00);
    *v = iVar2;
  }
  return bVar1;
}

Assistant:

bool
BmsHeaderTable::Query(const std::string& key, int* v)
{
	if (IsExists(key)) {
		*v = this->operator[](key).ToInteger();
		return true;
	}
	return false;
}